

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

Point3f __thiscall
pbrt::RealisticCamera::SampleExitPupil
          (RealisticCamera *this,Point2f *pFilm,Point2f *lensSample,Float *sampleBoundsArea)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  size_t sVar8;
  Bounds2<float> *pBVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 in_ZMM4 [64];
  Point3f PVar19;
  
  fVar1 = (pFilm->super_Tuple2<pbrt::Point2,_float>).y;
  fVar16 = (pFilm->super_Tuple2<pbrt::Point2,_float>).x;
  sVar8 = (this->exitPupilBounds).nStored;
  pBVar9 = (this->exitPupilBounds).ptr;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)fVar16),
                            ZEXT416((uint)fVar16));
  auVar12 = vsqrtss_avx(auVar12,auVar12);
  fVar18 = auVar12._0_4_;
  auVar12 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,sVar8);
  iVar14 = (int)sVar8 + -1;
  iVar15 = (int)((fVar18 / (*(float *)(((this->super_CameraBase).film.
                                        super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                                       0xffffffffffff) + 0x20) * 0.5)) * auVar12._0_4_);
  if (iVar15 <= iVar14) {
    iVar14 = iVar15;
  }
  fVar2 = pBVar9[iVar14].pMin.super_Tuple2<pbrt::Point2,_float>.x;
  fVar3 = pBVar9[iVar14].pMin.super_Tuple2<pbrt::Point2,_float>.y;
  fVar4 = pBVar9[iVar14].pMax.super_Tuple2<pbrt::Point2,_float>.x;
  fVar5 = pBVar9[iVar14].pMax.super_Tuple2<pbrt::Point2,_float>.y;
  if (sampleBoundsArea != (Float *)0x0) {
    *sampleBoundsArea = (fVar4 - fVar2) * (fVar5 - fVar3);
    fVar16 = (pFilm->super_Tuple2<pbrt::Point2,_float>).x;
    fVar1 = (pFilm->super_Tuple2<pbrt::Point2,_float>).y;
  }
  fVar6 = (lensSample->super_Tuple2<pbrt::Point2,_float>).x;
  fVar7 = (lensSample->super_Tuple2<pbrt::Point2,_float>).y;
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)(1.0 - fVar7)),
                            ZEXT416((uint)(fVar7 * fVar5)));
  auVar11 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)(1.0 - fVar6)),
                            ZEXT416((uint)(fVar4 * fVar6)));
  bVar10 = fVar18 != 0.0;
  fVar1 = (float)((uint)bVar10 * (int)(fVar1 / fVar18));
  auVar17._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar17._0_4_ = fVar1;
  fVar16 = (float)((uint)bVar10 * (int)(fVar16 / fVar18) + (uint)!bVar10 * 0x3f800000);
  auVar13 = vfmsub231ss_fma(ZEXT416((uint)(auVar12._0_4_ * fVar1)),ZEXT416((uint)fVar16),auVar11);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * auVar12._0_4_)),auVar17,auVar11);
  auVar12 = vinsertps_avx(auVar13,auVar12,0x10);
  PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar12._0_8_;
  PVar19.super_Tuple3<pbrt::Point3,_float>.z =
       (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].thickness;
  return (Point3f)PVar19.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

Point3f RealisticCamera::SampleExitPupil(const Point2f &pFilm, const Point2f &lensSample,
                                         Float *sampleBoundsArea) const {
    // Find exit pupil bound for sample distance from film center
    Float rFilm = std::sqrt(pFilm.x * pFilm.x + pFilm.y * pFilm.y);
    int rIndex = rFilm / (film.Diagonal() / 2) * exitPupilBounds.size();
    rIndex = std::min<int>(exitPupilBounds.size() - 1, rIndex);
    Bounds2f pupilBounds = exitPupilBounds[rIndex];
    if (sampleBoundsArea != nullptr)
        *sampleBoundsArea = pupilBounds.Area();

    // Generate sample point inside exit pupil bound
    Point2f pLens = pupilBounds.Lerp(lensSample);

    // Return sample point rotated by angle of _pFilm_ with $+x$ axis
    Float sinTheta = (rFilm != 0) ? pFilm.y / rFilm : 0;
    Float cosTheta = (rFilm != 0) ? pFilm.x / rFilm : 1;
    return {cosTheta * pLens.x - sinTheta * pLens.y,
            sinTheta * pLens.x + cosTheta * pLens.y, LensRearZ()};
}